

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O2

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar3 = N_VGetArrayPointer();
  lVar4 = N_VGetArrayPointer(y);
  uVar5 = N_VGetLength_Serial(x);
  uVar6 = N_VGetLength_Serial(y);
  if (uVar5 == uVar6) {
    uVar6 = 0;
    if ((long)uVar5 < 1) {
      uVar5 = uVar6;
    }
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar3 + uVar7 * 8),*(undefined8 *)(lVar4 + uVar7 * 8),
                             tol);
      uVar6 = (ulong)(uint)((int)uVar6 + iVar1);
    }
    uVar2 = (uint)(0 < (int)uVar6);
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}